

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O2

void mzd_share(lowmc_parameters_t *lowmc,mzd_local_t *r,mzd_local_t *v1,mzd_local_t *v2,
              mzd_local_t *v3)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  
  uVar1 = lowmc->n;
  if ((~DAT_001bf10c & 0x20400) != 0) {
    auVar2 = vpternlogq_avx512vl(*(undefined1 (*) [16])v3->w64,*(undefined1 (*) [16])v2->w64,
                                 *(undefined1 (*) [16])v1->w64,0x96);
    *(undefined1 (*) [16])r->w64 = auVar2;
    if (0x80 < uVar1) {
      auVar2 = vpternlogq_avx512vl(*(undefined1 (*) [16])(v3->w64 + 2),
                                   *(undefined1 (*) [16])(v2->w64 + 2),
                                   *(undefined1 (*) [16])(v1->w64 + 2),0x96);
      *(undefined1 (*) [16])(r->w64 + 2) = auVar2;
    }
    return;
  }
  if (0x80 < uVar1) {
    auVar3 = vpternlogq_avx512vl(*(undefined1 (*) [32])v3->w64,*(undefined1 (*) [32])v2->w64,
                                 *(undefined1 (*) [32])v1->w64,0x96);
    *(undefined1 (*) [32])r->w64 = auVar3;
    return;
  }
  auVar2 = vpternlogq_avx512vl(*(undefined1 (*) [16])v3->w64,*(undefined1 (*) [16])v2->w64,
                               *(undefined1 (*) [16])v1->w64,0x96);
  *(undefined1 (*) [16])r->w64 = auVar2;
  return;
}

Assistant:

static void mzd_share(const lowmc_parameters_t* lowmc, mzd_local_t* r, const mzd_local_t* v1,
                      const mzd_local_t* v2, const mzd_local_t* v3) {
#if defined(WITH_OPT)
#if defined(WITH_AVX2)
  if (CPU_SUPPORTS_AVX2) {
    if (lowmc->n > 128) {
      mzd_share_s256_256(r, v1, v2, v3);
    } else {
      mzd_share_s256_128(r, v1, v2, v3);
    }
    return;
  }
#endif
#if defined(WITH_SSE2) || defined(WITH_NEON)
  if (CPU_SUPPORTS_SSE2 || CPU_SUPPORTS_NEON) {
    if (lowmc->n > 128) {
      mzd_share_s128_256(r, v1, v2, v3);
    } else {
      mzd_share_s128_128(r, v1, v2, v3);
    }
    return;
  }
#endif
#endif

#if !defined(NO_UINT64_FALLBACK)
  if (lowmc->n <= 128) {
    mzd_share_uint64_128(r, v1, v2, v3);
  } else if (lowmc->n <= 192) {
    mzd_share_uint64_192(r, v1, v2, v3);
  } else {
    mzd_share_uint64_256(r, v1, v2, v3);
  }
#endif
}